

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

int __thiscall
QGridLayoutPrivate::heightForWidth(QGridLayoutPrivate *this,int w,int hSpacing,int vSpacing)

{
  int iVar1;
  int space;
  int iVar2;
  
  setupLayoutData(this,hSpacing,vSpacing);
  if ((this->field_0x194 & 8) == 0) {
    iVar2 = -1;
  }
  else {
    iVar2 = this->topMargin;
    iVar1 = this->bottomMargin;
    space = w - (this->rightMargin + this->leftMargin);
    if (space != this->hfw_width) {
      qGeomCalc(&this->colData,0,this->cc,0,space,-1);
      recalcHFW(this,space);
    }
    iVar2 = iVar1 + iVar2 + this->hfw_height;
  }
  return iVar2;
}

Assistant:

int QGridLayoutPrivate::heightForWidth(int w, int hSpacing, int vSpacing)
{
    setupLayoutData(hSpacing, vSpacing);
    if (!has_hfw)
        return -1;
    int left, top, right, bottom;
    effectiveMargins(&left, &top, &right, &bottom);

    int hMargins = left + right;
    if (w - hMargins != hfw_width) {
        qGeomCalc(colData, 0, cc, 0, w - hMargins);
        recalcHFW(w - hMargins);
    }
    return hfw_height + top + bottom;
}